

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_parser.h
# Opt level: O0

file * __thiscall cppcms::impl::multipart_parser::get_file(multipart_parser *this)

{
  undefined8 uVar1;
  element_type *peVar2;
  string *in_RDI;
  __shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffb0;
  allocator *paVar3;
  undefined3 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffc4;
  allocator local_29;
  string local_28 [40];
  
  if ((in_RDI[5].field_2._M_local_buf[0xc] & 1U) == 0) {
    uVar4 = CONCAT13(1,in_stack_ffffffffffffffc0);
    uVar1 = __cxa_allocate_exception(0x30);
    paVar3 = &local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Invalid state for get_file",paVar3);
    booster::logic_error::logic_error
              ((logic_error *)CONCAT44(in_stack_ffffffffffffffc4,uVar4),in_RDI);
    __cxa_throw(uVar1,&booster::logic_error::typeinfo,booster::logic_error::~logic_error);
  }
  peVar2 = std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*(in_stack_ffffffffffffffb0);
  return peVar2;
}

Assistant:

http::file &get_file()
			{
				if(!file_is_ready_)
					throw booster::logic_error("Invalid state for get_file");
				return *file_;
			}